

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall arealights::Application::createFramebuffer(Application *this,ivec2 *resolution)

{
  Logger *pLVar1;
  char cVar2;
  byte bVar3;
  GLenum GVar4;
  Writer *pWVar5;
  uint rboDepth;
  Writer local_90;
  
  (*glad_glGenFramebuffers)(1,&this->_intermediateFBO);
  (*glad_glBindFramebuffer)(0x8d40,this->_intermediateFBO);
  (*glad_glGenTextures)(1,&this->_intermediateFBOTexture);
  (*glad_glBindTexture)(0xde1,this->_intermediateFBOTexture);
  (*glad_glTexImage2D)
            (0xde1,0,0x881a,(resolution->field_0).field_0.x,(resolution->field_0).field_0.y,0,0x1908
             ,0x1406,(void *)0x0);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,this->_intermediateFBOTexture,0);
  (*glad_glGenRenderbuffers)(1,&rboDepth);
  (*glad_glBindRenderbuffer)(0x8d41,rboDepth);
  (*glad_glRenderbufferStorage)
            (0x8d41,0x88f0,(resolution->field_0).field_0.x,(resolution->field_0).field_0.y);
  (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,rboDepth);
  GVar4 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar4 != 0x8cd5) {
    local_90._vptr_Writer = (_func_int **)&PTR__Writer_001f54f0;
    local_90.m_level = Error;
    local_90.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
    ;
    local_90.m_line = 0x87;
    local_90.m_func = "void arealights::Application::createFramebuffer(const glm::ivec2 &)";
    local_90.m_verboseLevel = 0;
    local_90.m_logger = (Logger *)0x0;
    local_90.m_proceed = false;
    local_90.m_messageBuilder.m_logger = (Logger *)0x0;
    local_90.m_messageBuilder.m_containerLogSeperator = "";
    local_90.m_dispatchAction = NormalLog;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar5 = el::base::Writer::construct(&local_90,1,"framework");
    bVar3 = pWVar5->m_proceed;
    if ((bool)bVar3 == true) {
      el::base::MessageBuilder::operator<<(&pWVar5->m_messageBuilder,"Framebuffer not complete!");
      bVar3 = pWVar5->m_proceed;
    }
    if ((bVar3 & 1) != 0) {
      pLVar1 = (pWVar5->m_messageBuilder).m_logger;
      cVar2 = (char)pLVar1 + 'P';
      std::ios::widen((char)*(undefined8 *)(*(long *)&pLVar1->field_0x50 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    el::base::Writer::~Writer(&local_90);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Application::createFramebuffer(const glm::ivec2 &resolution)
{
    glGenFramebuffers(1, &_intermediateFBO);
    glBindFramebuffer(GL_FRAMEBUFFER, _intermediateFBO);

    glGenTextures(1, &_intermediateFBOTexture);
    glBindTexture(GL_TEXTURE_2D, _intermediateFBOTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA16F, resolution.x, resolution.y, 0, GL_RGBA, GL_FLOAT, nullptr);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, _intermediateFBOTexture, 0);

    unsigned int rboDepth;
    glGenRenderbuffers(1, &rboDepth);
    glBindRenderbuffer(GL_RENDERBUFFER, rboDepth);
    glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, resolution.x, resolution.y);
    glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rboDepth);

    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
            LOG(ERROR) << "Framebuffer not complete!" << std::endl;
        }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
}